

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

CallInfo * luaE_extendCI(lua_State *L)

{
  undefined2 uVar1;
  CallInfo *pCVar2;
  CallInfo *pCVar3;
  
  pCVar3 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x48);
  pCVar3->jitstatus = '\0';
  pCVar2 = L->ci;
  uVar1 = pCVar2->stacklevel;
  pCVar3->stacklevel = uVar1 + 1;
  if (pCVar2->next == (CallInfo *)0x0) {
    pCVar2->next = pCVar3;
    pCVar3->previous = pCVar2;
    pCVar3->next = (CallInfo *)0x0;
    pCVar3->magic = '*';
    L->nci = L->nci + 1;
    return pCVar3;
  }
  __assert_fail("L->ci->next == ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x6c,"CallInfo *luaE_extendCI(lua_State *)");
}

Assistant:

CallInfo *luaE_extendCI (lua_State *L) {
  CallInfo *ci = luaM_new(L, CallInfo);
  ci->jitstatus = 0;
  ci->stacklevel = L->ci->stacklevel+1;
  lua_assert(L->ci->next == NULL);
  L->ci->next = ci;
  ci->previous = L->ci;
  ci->next = NULL;
  ci->magic = 42;
  L->nci++;
  return ci;
}